

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_trim(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char cVar1;
  ulong in_RAX;
  char *zString;
  ushort **ppuVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  int nLen;
  int nListlen;
  undefined8 local_38;
  
  if (nArg < 1) {
    jx9_result_null(pCtx);
    return 0;
  }
  local_38 = in_RAX;
  zString = jx9_value_to_string(*apArg,(int *)&local_38);
  if (0 < (long)(int)local_38) {
    if (nArg == 1) {
      pcVar8 = zString + (int)local_38;
      for (uVar5 = local_38 & 0xffffffff; pcVar6 = pcVar8, (int)uVar5 != 0; uVar5 = uVar5 - 1) {
        cVar1 = *zString;
        pcVar6 = zString;
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           ((cVar1 != '\0' &&
            (ppuVar2 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0)))) break;
        zString = zString + 1;
      }
LAB_0012b372:
      zString = pcVar6;
      uVar7 = uVar5;
      if (uVar7 != 0) {
        cVar1 = zString[uVar7 - 1];
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           ((uVar5 = uVar7 - 1, pcVar6 = zString, cVar1 != '\0' &&
            (ppuVar2 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0)))) goto LAB_0012b3a1;
        goto LAB_0012b372;
      }
      uVar7 = 0;
LAB_0012b3a1:
      local_38._0_4_ = (int)uVar7;
      goto LAB_0012b3b2;
    }
    pcVar8 = jx9_value_to_string(apArg[1],(int *)((long)&local_38 + 4));
    if ((long)(int)local_38._4_4_ < 1) goto LAB_0012b3b2;
    pcVar3 = zString + (int)local_38;
    pcVar6 = zString;
    do {
      zString = pcVar6;
      if (pcVar3 <= zString) break;
      pcVar6 = zString;
      for (lVar4 = 0; (int)local_38._4_4_ != lVar4; lVar4 = lVar4 + 1) {
        if (pcVar6 < pcVar3) {
          pcVar6 = pcVar6 + (*pcVar6 == pcVar8[lVar4]);
        }
      }
    } while (pcVar6 != zString);
    pcVar6 = pcVar3 + -1;
    do {
      pcVar3 = pcVar6;
      if (pcVar3 <= zString) goto LAB_0012b361;
      pcVar6 = pcVar3;
      for (uVar5 = 0; local_38._4_4_ != uVar5; uVar5 = uVar5 + 1) {
        if (zString < pcVar6) {
          pcVar6 = pcVar6 + -(ulong)(*pcVar6 == pcVar8[uVar5]);
        }
      }
    } while (pcVar6 != pcVar3);
    if (zString < pcVar3) {
      local_38._0_4_ = ((int)pcVar3 - (int)zString) + 1;
      goto LAB_0012b3b2;
    }
  }
LAB_0012b361:
  zString = "";
  local_38._0_4_ = 0;
LAB_0012b3b2:
  jx9_result_string(pCtx,zString,(int)local_38);
  return 0;
}

Assistant:

static int jx9Builtin_trim(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Start the trim process */
	if( nArg < 2 ){
		SyString sStr;
		/* Remove white spaces and NUL bytes */
		SyStringInitFromBuf(&sStr, zString, nLen);
		SyStringFullTrimSafe(&sStr);
		jx9_result_string(pCtx, sStr.zString, (int)sStr.nByte);
	}else{
		/* Char list */
		const char *zList;
		int nListlen;
		zList = jx9_value_to_string(apArg[1], &nListlen);
		if( nListlen < 1 ){
			/* Return the string unchanged */
			jx9_result_string(pCtx, zString, nLen);
		}else{
			const char *zEnd = &zString[nLen];
			const char *zCur = zString;
			const char *zPtr;
			int i;
			/* Left trim */
			for(;;){
				if( zCur >= zEnd ){
					break;
				}
				zPtr = zCur;
				for( i = 0 ; i < nListlen ; i++ ){
					if( zCur < zEnd && zCur[0] == zList[i] ){
						zCur++;
					}
				}
				if( zCur == zPtr ){
					/* No match, break immediately */
					break;
				}
			}
			/* Right trim */
			zEnd--;
			for(;;){
				if( zEnd <= zCur ){
					break;
				}
				zPtr = zEnd;
				for( i = 0 ; i < nListlen ; i++ ){
					if( zEnd > zCur && zEnd[0] == zList[i] ){
						zEnd--;
					}
				}
				if( zEnd == zPtr ){
					break;
				}
			}
			if( zCur >= zEnd ){
				/* Return the empty string */
				jx9_result_string(pCtx, "", 0);
			}else{
				zEnd++;
				jx9_result_string(pCtx, zCur, (int)(zEnd-zCur));
			}
		}
	}
	return JX9_OK;
}